

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O2

void helper_pslldq_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  uVar1 = 0x10;
  if ((int)s->_l_ZMMReg[0] < 0x10) {
    uVar1 = s->_l_ZMMReg[0];
  }
  for (lVar4 = 0xf; (int)uVar1 <= lVar4; lVar4 = lVar4 + -1) {
    d->_b_ZMMReg[lVar4] = d->_b_ZMMReg[lVar4 - (int)uVar1];
  }
  uVar3 = 0;
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    d->_b_ZMMReg[uVar3] = '\0';
  }
  return;
}

Assistant:

void glue(helper_pslldq, SUFFIX)(CPUX86State *env, Reg *d, Reg *s)
{
    int shift, i;

    shift = s->L(0);
    if (shift > 16) {
        shift = 16;
    }
    for (i = 15; i >= shift; i--) {
        d->B(i) = d->B(i - shift);
    }
    for (i = 0; i < shift; i++) {
        d->B(i) = 0;
    }
}